

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall
QFileDialogPrivate::fileRenamed
          (QFileDialogPrivate *this,QString *path,QString *oldName,QString *newName)

{
  long lVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QString local_68;
  QArrayData *local_50;
  char16_t *local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = QFileDialogOptions::fileMode();
  if (iVar4 != 2) goto LAB_004f174a;
  if (this->model == (QFileSystemModel *)0x0) {
    local_50 = (QArrayData *)0x0;
    local_48 = L"/";
    local_40 = 1;
  }
  else {
    QFileSystemModel::rootPath();
  }
  lVar1 = (path->d).size;
  if (lVar1 == local_40) {
    QVar5.m_data = (path->d).ptr;
    QVar5.m_size = lVar1;
    QVar7.m_data = local_48;
    QVar7.m_size = local_40;
    cVar2 = QtPrivate::equalStrings(QVar5,QVar7);
  }
  else {
    cVar2 = '\0';
  }
  if (cVar2 == '\0') {
LAB_004f16e4:
    cVar3 = '\0';
  }
  else {
    QLineEdit::text(&local_68,&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
    lVar1 = (oldName->d).size;
    if (local_68.d.size != lVar1) goto LAB_004f16e4;
    QVar6.m_data = local_68.d.ptr;
    QVar6.m_size = local_68.d.size;
    QVar8.m_data = (oldName->d).ptr;
    QVar8.m_size = lVar1;
    cVar3 = QtPrivate::equalStrings(QVar6,QVar8);
  }
  if ((cVar2 != '\0') && (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  if (cVar3 != '\0') {
    QLineEdit::setText(&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit,newName);
  }
LAB_004f174a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::fileRenamed(const QString &path, const QString &oldName, const QString &newName)
{
    const QFileDialog::FileMode fileMode = q_func()->fileMode();
    if (fileMode == QFileDialog::Directory) {
        if (path == rootPath() && lineEdit()->text() == oldName)
            lineEdit()->setText(newName);
    }
}